

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::ScaleCoordsFromWindow(SDLFB *this,SWORD *x,SWORD *y)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double yratio;
  double xratio;
  int realh;
  int realw;
  int h;
  int w;
  SWORD *y_local;
  SWORD *x_local;
  SDLFB *this_local;
  
  _h = y;
  y_local = x;
  x_local = (SWORD *)this;
  SDL_GetWindowSize(this->Screen,&realw,&realh);
  uVar1 = (*(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
            [0x21])();
  if ((uVar1 & 1) == 0) {
    *y_local = (SWORD)(((int)*y_local *
                       (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width) / realw);
    *_h = (short)(((int)*_h * (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height) /
                 realh);
  }
  else {
    xratio._4_4_ = realw;
    xratio._0_4_ = realh;
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar3 = DCanvas::GetHeight((DCanvas *)screen);
    ScaleWithAspect((int *)((long)&xratio + 4),(int *)&xratio,iVar2,iVar3);
    iVar3 = xratio._4_4_;
    iVar4 = DCanvas::GetWidth((DCanvas *)screen);
    iVar2 = xratio._0_4_;
    if ((iVar3 != iVar4) || (iVar3 = DCanvas::GetHeight((DCanvas *)screen), iVar2 != iVar3)) {
      iVar2 = DCanvas::GetWidth((DCanvas *)screen);
      dVar5 = (double)xratio._4_4_;
      iVar3 = DCanvas::GetHeight((DCanvas *)screen);
      if (xratio._4_4_ < realw) {
        *y_local = (SWORD)(int)((double)((int)*y_local - (realw - xratio._4_4_) / 2) *
                               ((double)iVar2 / dVar5));
        *_h = (short)(int)((double)(int)*_h * ((double)iVar3 / (double)xratio._0_4_));
      }
      else {
        *_h = (short)(int)((double)((int)*_h - (realh - xratio._0_4_) / 2) *
                          ((double)iVar3 / (double)xratio._0_4_));
        *y_local = (SWORD)(int)((double)(int)*y_local * ((double)iVar2 / dVar5));
      }
    }
  }
  return;
}

Assistant:

void SDLFB::ScaleCoordsFromWindow(SWORD &x, SWORD &y)
{
	int w, h;
	SDL_GetWindowSize (Screen, &w, &h);

	// Detect if we're doing scaling in the Window and adjust the mouse
	// coordinates accordingly. This could be more efficent, but I
	// don't think performance is an issue in the menus.
	if(IsFullscreen())
	{
		int realw = w, realh = h;
		ScaleWithAspect (realw, realh, SCREENWIDTH, SCREENHEIGHT);
		if (realw != SCREENWIDTH || realh != SCREENHEIGHT)
		{
			double xratio = (double)SCREENWIDTH/realw;
			double yratio = (double)SCREENHEIGHT/realh;
			if (realw < w)
			{
				x = (x - (w - realw)/2)*xratio;
				y *= yratio;
			}
			else
			{
				y = (y - (h - realh)/2)*yratio;
				x *= xratio;
			}
		}
	}
	else
	{
		x = (SWORD)(x*Width/w);
		y = (SWORD)(y*Height/h);
	}
}